

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc.cpp
# Opt level: O0

double __thiscall spatial_region::get_rand(spatial_region *this)

{
  int local_24;
  double a;
  spatial_region *this_local;
  
  a = this->random[this->n_random % 0x37] - this->random[(this->n_random + 0x1f) % 0x37];
  if (a < 0.0) {
    a = a + 1.0;
  }
  this->random[this->n_random % 0x37] = a;
  if (this->n_random < 0x37) {
    local_24 = this->n_random + 1;
  }
  else {
    local_24 = 0;
  }
  this->n_random = local_24;
  return a;
}

Assistant:

double spatial_region::get_rand()
{
    // Метод Фибоначчи с запаздываниями
    double a;
    /* для неограниченного массива было бы
       a = random[n_random-55] - random[n_random-24]; */
    a = random[n_random%55] - random[(n_random+31)%55]; // 55-24=31
    if (a<0) a = a + 1;
    random[n_random%55] = a;
    n_random = n_random < 55 ? n_random + 1 : 0;
    return a;
}